

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O3

int FIX::double_conversion::CompareBufferWithDiyFp
              (Vector<const_char> buffer,int exponent,DiyFp diy_fp)

{
  int iVar1;
  Bignum *pBVar2;
  Vector<const_char> value;
  Bignum diy_fp_bignum;
  Bignum buffer_bignum;
  Bignum local_460;
  Bignum local_248;
  
  iVar1 = exponent + buffer.length_;
  if (0x136 < iVar1) {
    __assert_fail("buffer.length() + exponent <= kMaxDecimalPower + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/strtod.cc"
                  ,0x18d,
                  "int FIX::double_conversion::CompareBufferWithDiyFp(Vector<const char>, int, DiyFp)"
                 );
  }
  if (-0x144 < iVar1) {
    iVar1 = diy_fp.e_;
    if (buffer.length_ < 0x30d) {
      Bignum::Bignum(&local_248);
      Bignum::Bignum(&local_460);
      value._12_4_ = 0;
      value.start_ = (char *)SUB128(buffer._0_12_,0);
      value.length_ = SUB124(buffer._0_12_,8);
      Bignum::AssignDecimalString(&local_248,value);
      Bignum::AssignUInt64(&local_460,diy_fp.f_);
      if (exponent < 0) {
        exponent = -exponent;
        pBVar2 = &local_460;
      }
      else {
        pBVar2 = &local_248;
      }
      Bignum::MultiplyByPowerOfTen(pBVar2,exponent);
      if (iVar1 < 1) {
        iVar1 = -iVar1;
        pBVar2 = &local_248;
      }
      else {
        pBVar2 = &local_460;
      }
      Bignum::ShiftLeft(pBVar2,iVar1);
      iVar1 = Bignum::Compare(&local_248,&local_460);
      return iVar1;
    }
    __assert_fail("buffer.length() <= kMaxSignificantDecimalDigits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/strtod.cc"
                  ,399,
                  "int FIX::double_conversion::CompareBufferWithDiyFp(Vector<const char>, int, DiyFp)"
                 );
  }
  __assert_fail("buffer.length() + exponent > kMinDecimalPower",
                "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/strtod.cc"
                ,0x18e,
                "int FIX::double_conversion::CompareBufferWithDiyFp(Vector<const char>, int, DiyFp)"
               );
}

Assistant:

static int CompareBufferWithDiyFp(Vector<const char> buffer,
                                  int exponent,
                                  DiyFp diy_fp) {
  ASSERT(buffer.length() + exponent <= kMaxDecimalPower + 1);
  ASSERT(buffer.length() + exponent > kMinDecimalPower);
  ASSERT(buffer.length() <= kMaxSignificantDecimalDigits);
  // Make sure that the Bignum will be able to hold all our numbers.
  // Our Bignum implementation has a separate field for exponents. Shifts will
  // consume at most one bigit (< 64 bits).
  // ln(10) == 3.3219...
  ASSERT(((kMaxDecimalPower + 1) * 333 / 100) < Bignum::kMaxSignificantBits);
  Bignum buffer_bignum;
  Bignum diy_fp_bignum;
  buffer_bignum.AssignDecimalString(buffer);
  diy_fp_bignum.AssignUInt64(diy_fp.f());
  if (exponent >= 0) {
    buffer_bignum.MultiplyByPowerOfTen(exponent);
  } else {
    diy_fp_bignum.MultiplyByPowerOfTen(-exponent);
  }
  if (diy_fp.e() > 0) {
    diy_fp_bignum.ShiftLeft(diy_fp.e());
  } else {
    buffer_bignum.ShiftLeft(-diy_fp.e());
  }
  return Bignum::Compare(buffer_bignum, diy_fp_bignum);
}